

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O1

void __thiscall
btConeTwistConstraint::solveConstraintObsolete
          (btConeTwistConstraint *this,btSolverBody *bodyA,btSolverBody *bodyB,btScalar timeStep)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  btRigidBody *pbVar15;
  btRigidBody *pbVar16;
  btRigidBody *pbVar17;
  btRigidBody *pbVar18;
  long lVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  btScalar bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  btVector3 omegaB;
  btVector3 omegaA;
  btVector3 omegaADes;
  btVector3 omegaBDes;
  btTransform trBCur;
  btTransform trACur;
  btTransform trAPred;
  btTransform trBPred;
  float local_418;
  float fStack_414;
  float local_368;
  float fStack_364;
  float fStack_354;
  btVector3 local_298;
  btVector3 local_288;
  float local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  btVector3 local_228;
  btVector3 local_218;
  btVector3 local_208;
  btTransform local_1f8;
  btTransform local_1b8;
  undefined1 local_170 [48];
  undefined1 local_140 [8];
  float fStack_138;
  btTransform local_130;
  btTransform local_f0;
  btMatrix3x3 local_b0;
  undefined8 local_80;
  undefined8 uStack_78;
  btTransform local_70;
  
  if (this->m_useSolveConstraintObsolete != true) {
    return;
  }
  pbVar15 = (this->super_btTypedConstraint).m_rbA;
  pbVar16 = (this->super_btTypedConstraint).m_rbB;
  if (this->m_angularOnly == false) {
    fVar48 = (this->m_rbBFrame).m_origin.m_floats[2];
    fVar50 = (this->m_rbBFrame).m_origin.m_floats[0];
    fVar56 = (this->m_rbBFrame).m_origin.m_floats[1];
    fVar43 = (pbVar16->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
    fVar42 = (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] *
             fVar48 + (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                      [0] * fVar50 +
                      (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                      [1] * fVar56 + fVar43;
    fVar40 = (pbVar16->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
    fVar38 = (pbVar16->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
    fVar37 = (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] *
             fVar48 + (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                      [0] * fVar50 +
                      (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                      [1] * fVar56 + fVar38;
    fVar28 = fVar48 * (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                      [2] +
             fVar50 * (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                      [0] +
             fVar56 * (pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                      [1] + fVar40;
    fVar48 = (this->m_rbAFrame).m_origin.m_floats[2];
    fVar50 = (this->m_rbAFrame).m_origin.m_floats[0];
    fVar56 = (this->m_rbAFrame).m_origin.m_floats[1];
    fVar45 = (pbVar15->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
    fVar51 = (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] *
             fVar48 + (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                      [0] * fVar50 +
                      (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                      [1] * fVar56 + fVar45;
    fVar36 = (pbVar15->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
    fVar58 = (pbVar15->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
    fVar53 = (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] *
             fVar48 + (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                      [0] * fVar50 +
                      (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                      [1] * fVar56 + fVar58;
    fVar46 = fVar48 * (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                      [2] +
             fVar50 * (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                      [0] +
             fVar56 * (pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                      [1] + fVar36;
    fVar36 = fVar46 - fVar36;
    fVar58 = fVar53 - fVar58;
    fVar45 = fVar51 - fVar45;
    fVar40 = fVar28 - fVar40;
    fVar48 = (bodyA->m_linearVelocity).m_floats[0];
    fVar50 = (bodyA->m_linearVelocity).m_floats[1];
    fVar56 = (bodyA->m_deltaLinearVelocity).m_floats[0];
    fVar49 = (bodyA->m_deltaLinearVelocity).m_floats[1];
    fVar38 = fVar37 - fVar38;
    fVar55 = (bodyA->m_linearVelocity).m_floats[2];
    fVar57 = (bodyA->m_deltaLinearVelocity).m_floats[2];
    fVar34 = (bodyA->m_angularVelocity).m_floats[1] + (bodyA->m_deltaAngularVelocity).m_floats[1];
    fVar47 = (bodyA->m_angularVelocity).m_floats[2] + (bodyA->m_deltaAngularVelocity).m_floats[2];
    fVar43 = fVar42 - fVar43;
    fVar52 = (bodyA->m_angularVelocity).m_floats[0] + (bodyA->m_deltaAngularVelocity).m_floats[0];
    fVar21 = (bodyB->m_angularVelocity).m_floats[1] + (bodyB->m_deltaAngularVelocity).m_floats[1];
    fVar25 = (bodyB->m_angularVelocity).m_floats[2] + (bodyB->m_deltaAngularVelocity).m_floats[2];
    fVar23 = (bodyB->m_linearVelocity).m_floats[0];
    fVar24 = (bodyB->m_deltaLinearVelocity).m_floats[0];
    fVar26 = (bodyB->m_angularVelocity).m_floats[0] + (bodyB->m_deltaAngularVelocity).m_floats[0];
    fVar35 = (bodyB->m_linearVelocity).m_floats[1];
    fVar31 = (bodyB->m_deltaLinearVelocity).m_floats[1];
    fVar41 = (bodyB->m_linearVelocity).m_floats[2];
    fVar32 = (bodyB->m_deltaLinearVelocity).m_floats[2];
    pbVar17 = bodyA->m_originalBody;
    pbVar18 = bodyB->m_originalBody;
    lVar19 = 0;
    do {
      fVar22 = 1.0 / *(float *)((long)(&this->m_jac[0].m_1MinvJt + 1) + lVar19);
      uVar11 = *(undefined8 *)((long)this->m_jac[0].m_linearJointAxis.m_floats + lVar19);
      fVar29 = (float)uVar11;
      fVar33 = (float)((ulong)uVar11 >> 0x20);
      fVar1 = *(float *)((long)this->m_jac[0].m_linearJointAxis.m_floats + lVar19 + 8);
      fVar22 = ((((fVar51 - fVar42) * fVar1 +
                 (fVar46 - fVar28) * fVar29 + (fVar53 - fVar37) * fVar33) * -0.3) / timeStep) *
               fVar22 - (fVar1 * (((fVar52 * fVar58 - fVar36 * fVar34) + fVar55 + fVar57) -
                                 ((fVar26 * fVar38 - fVar40 * fVar21) + fVar41 + fVar32)) +
                        fVar29 * (((fVar34 * fVar45 - fVar58 * fVar47) + fVar48 + fVar56) -
                                 ((fVar21 * fVar43 - fVar38 * fVar25) + fVar23 + fVar24)) +
                        (((fVar47 * fVar36 - fVar45 * fVar52) + fVar50 + fVar49) -
                        ((fVar25 * fVar40 - fVar43 * fVar26) + fVar35 + fVar31)) * fVar33) * fVar22;
      (this->super_btTypedConstraint).m_appliedImpulse =
           (this->super_btTypedConstraint).m_appliedImpulse + fVar22;
      if (pbVar17 != (btRigidBody *)0x0) {
        fVar54 = fVar36 * fVar33 + fVar29 * -fVar58;
        fVar59 = fVar58 * fVar1 + fVar33 * -fVar45;
        fVar44 = fVar1 * -fVar36 + fVar45 * fVar29;
        fVar2 = *(float *)&pbVar15->field_0x170;
        fVar3 = *(float *)&pbVar15->field_0x16c;
        fVar4 = *(float *)&pbVar15->field_0x174;
        fVar5 = pbVar15->m_inverseMass;
        fVar6 = (bodyA->m_linearFactor).m_floats[2];
        uVar11 = *(undefined8 *)(bodyA->m_deltaLinearVelocity).m_floats;
        uVar12 = *(undefined8 *)(bodyA->m_deltaAngularVelocity).m_floats;
        uVar13 = *(undefined8 *)(bodyA->m_angularFactor).m_floats;
        uVar14 = *(undefined8 *)(bodyA->m_linearFactor).m_floats;
        fVar7 = *(float *)&pbVar15->field_0x160;
        fVar8 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
        fVar9 = *(float *)&pbVar15->field_0x150;
        fVar10 = *(float *)&pbVar15->field_0x154;
        fVar30 = *(float *)&pbVar15->field_0x15c;
        fVar39 = *(float *)&pbVar15->field_0x164;
        *(ulong *)(bodyA->m_deltaLinearVelocity).m_floats =
             CONCAT44((float)((ulong)uVar14 >> 0x20) * fVar5 * fVar33 * fVar22 +
                      (float)((ulong)uVar11 >> 0x20),
                      (float)uVar14 * fVar5 * fVar29 * fVar22 + (float)uVar11);
        (bodyA->m_deltaLinearVelocity).m_floats[2] =
             fVar1 * fVar5 * fVar22 * fVar6 + (bodyA->m_deltaLinearVelocity).m_floats[2];
        fVar5 = (bodyA->m_angularFactor).m_floats[2];
        local_418 = (float)uVar12;
        fStack_414 = (float)((ulong)uVar12 >> 0x20);
        *(ulong *)(bodyA->m_deltaAngularVelocity).m_floats =
             CONCAT44((float)((ulong)uVar13 >> 0x20) * fVar22 *
                      (fVar54 * fVar39 + fVar59 * fVar30 + fVar44 * fVar7) + fStack_414,
                      (float)uVar13 * fVar22 * (fVar54 * fVar10 + fVar59 * fVar8 + fVar44 * fVar9) +
                      local_418);
        (bodyA->m_deltaAngularVelocity).m_floats[2] =
             fVar5 * fVar22 * (fVar4 * fVar54 + fVar3 * fVar59 + fVar2 * fVar44) +
             (bodyA->m_deltaAngularVelocity).m_floats[2];
      }
      if (pbVar18 != (btRigidBody *)0x0) {
        fVar44 = fVar38 * fVar1 + fVar33 * -fVar43;
        fVar39 = fVar43 * fVar29 + fVar1 * -fVar40;
        fVar30 = fVar29 * -fVar38 + fVar40 * fVar33;
        fVar1 = *(float *)&pbVar16->field_0x170;
        fVar29 = *(float *)&pbVar16->field_0x16c;
        fVar33 = *(float *)&pbVar16->field_0x174;
        fVar2 = pbVar16->m_inverseMass;
        fVar3 = *(float *)((long)this->m_jac[0].m_linearJointAxis.m_floats + lVar19 + 8);
        uVar11 = *(undefined8 *)((long)this->m_jac[0].m_linearJointAxis.m_floats + lVar19);
        uVar12 = *(undefined8 *)(bodyB->m_linearFactor).m_floats;
        uVar13 = *(undefined8 *)(bodyB->m_deltaLinearVelocity).m_floats;
        fVar4 = *(float *)&pbVar16->field_0x160;
        fVar5 = *(float *)&(pbVar16->super_btCollisionObject).field_0x14c;
        fVar6 = *(float *)&pbVar16->field_0x150;
        fVar7 = *(float *)&pbVar16->field_0x154;
        fVar8 = *(float *)&pbVar16->field_0x15c;
        fVar9 = *(float *)&pbVar16->field_0x164;
        fVar10 = (bodyB->m_linearFactor).m_floats[2];
        *(ulong *)(bodyB->m_deltaLinearVelocity).m_floats =
             CONCAT44((float)((ulong)uVar13 >> 0x20) -
                      (float)((ulong)uVar12 >> 0x20) *
                      fVar2 * (float)((ulong)uVar11 >> 0x20) * fVar22,
                      (float)uVar13 - (float)uVar12 * fVar2 * (float)uVar11 * fVar22);
        (bodyB->m_deltaLinearVelocity).m_floats[2] =
             (bodyB->m_deltaLinearVelocity).m_floats[2] - fVar3 * fVar2 * fVar22 * fVar10;
        fVar2 = (bodyB->m_angularFactor).m_floats[2];
        uVar11 = *(undefined8 *)(bodyB->m_angularFactor).m_floats;
        uVar12 = *(undefined8 *)(bodyB->m_deltaAngularVelocity).m_floats;
        *(ulong *)(bodyB->m_deltaAngularVelocity).m_floats =
             CONCAT44((float)((ulong)uVar12 >> 0x20) -
                      (float)((ulong)uVar11 >> 0x20) * fVar22 *
                      (fVar30 * fVar9 + fVar44 * fVar8 + fVar39 * fVar4),
                      (float)uVar12 -
                      (float)uVar11 * fVar22 * (fVar30 * fVar7 + fVar44 * fVar5 + fVar39 * fVar6));
        (bodyB->m_deltaAngularVelocity).m_floats[2] =
             (bodyB->m_deltaAngularVelocity).m_floats[2] -
             fVar22 * fVar2 * (fVar33 * fVar30 + fVar29 * fVar44 + fVar1 * fVar39);
      }
      lVar19 = lVar19 + 0x54;
    } while (lVar19 != 0xfc);
  }
  if (this->m_bMotorEnabled == true) {
    local_1b8.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
    ;
    local_1b8.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 2);
    local_1b8.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
    ;
    local_1b8.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2);
    local_1b8.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
    ;
    local_1b8.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar15->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2);
    local_1b8.m_origin.m_floats._0_8_ =
         *(undefined8 *)(pbVar15->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
    local_1b8.m_origin.m_floats._8_8_ =
         *(undefined8 *)((pbVar15->super_btCollisionObject).m_worldTransform.m_origin.m_floats + 2);
    local_1f8.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
    ;
    local_1f8.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 2);
    local_1f8.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
    ;
    local_1f8.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2);
    local_1f8.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
    ;
    local_1f8.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)
          ((pbVar16->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2);
    local_1f8.m_origin.m_floats._0_8_ =
         *(undefined8 *)(pbVar16->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
    local_1f8.m_origin.m_floats._8_8_ =
         *(undefined8 *)((pbVar16->super_btCollisionObject).m_worldTransform.m_origin.m_floats + 2);
    uVar11 = *(undefined8 *)(bodyA->m_deltaAngularVelocity).m_floats;
    uVar12 = *(undefined8 *)(bodyA->m_angularVelocity).m_floats;
    local_228.m_floats[1] = (float)((ulong)uVar12 >> 0x20) + (float)((ulong)uVar11 >> 0x20);
    local_228.m_floats[0] = (float)uVar12 + (float)uVar11;
    local_228.m_floats[2] =
         (bodyA->m_angularVelocity).m_floats[2] + (bodyA->m_deltaAngularVelocity).m_floats[2];
    local_228.m_floats[3] = 0.0;
    uVar11 = *(undefined8 *)(bodyB->m_deltaAngularVelocity).m_floats;
    uVar12 = *(undefined8 *)(bodyB->m_angularVelocity).m_floats;
    local_288.m_floats[1] = (float)((ulong)uVar12 >> 0x20) + (float)((ulong)uVar11 >> 0x20);
    local_288.m_floats[0] = (float)uVar12 + (float)uVar11;
    local_288.m_floats[2] =
         (bodyB->m_angularVelocity).m_floats[2] + (bodyB->m_deltaAngularVelocity).m_floats[2];
    local_288.m_floats[3] = 0.0;
    local_130.m_basis.m_el[0].m_floats[0] = 1.0;
    local_298.m_floats = (btScalar  [4])ZEXT416(0);
    local_130.m_basis.m_el[1].m_floats[1] = 1.0;
    local_130.m_basis.m_el[2].m_floats[2] = 1.0;
    local_130.m_origin.m_floats[3] = 0.0;
    local_130.m_basis.m_el._4_16_ = local_298.m_floats;
    local_130.m_basis.m_el._24_16_ = local_298.m_floats;
    local_130._44_16_ = local_298.m_floats;
    btTransformUtil::integrateTransform(&local_1b8,&local_298,&local_228,timeStep,&local_130);
    local_70.m_basis.m_el[0].m_floats[0] = 1.0;
    local_70.m_basis.m_el[0].m_floats[1] = 0.0;
    local_70.m_basis.m_el[0].m_floats[2] = 0.0;
    local_70.m_basis.m_el[0].m_floats[3] = 0.0;
    local_70.m_basis.m_el[1].m_floats[0] = 0.0;
    local_70.m_basis.m_el[1].m_floats[1] = 1.0;
    local_70.m_basis.m_el[1].m_floats[2] = 0.0;
    local_70.m_basis.m_el[1].m_floats[3] = 0.0;
    local_70.m_basis.m_el[2].m_floats[0] = 0.0;
    local_70.m_basis.m_el[2].m_floats[1] = 0.0;
    local_70.m_basis.m_el[2].m_floats[2] = 1.0;
    local_70.m_basis.m_el[2].m_floats[3] = 0.0;
    local_70.m_origin.m_floats[0] = 0.0;
    local_70.m_origin.m_floats[1] = 0.0;
    local_70.m_origin.m_floats[2] = 0.0;
    local_70.m_origin.m_floats[3] = 0.0;
    btTransformUtil::integrateTransform(&local_1f8,&local_298,&local_288,timeStep,&local_70);
    btMatrix3x3::setRotation(&local_b0,&this->m_qTarget);
    local_80 = 0;
    uStack_78 = 0;
    fVar48 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[0];
    fVar50 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[1];
    fVar56 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[2];
    fVar21 = local_b0.m_el[2].m_floats[0] * fVar56 +
             local_b0.m_el[0].m_floats[0] * fVar48 + local_b0.m_el[1].m_floats[0] * fVar50;
    fVar41 = local_b0.m_el[2].m_floats[1] * fVar56 +
             local_b0.m_el[0].m_floats[1] * fVar48 + local_b0.m_el[1].m_floats[1] * fVar50;
    fVar31 = local_b0.m_el[2].m_floats[2] * fVar56 +
             local_b0.m_el[0].m_floats[2] * fVar48 + local_b0.m_el[1].m_floats[2] * fVar50;
    fVar43 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[1];
    fVar40 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[0];
    fVar38 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[2];
    fVar45 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[1];
    fVar36 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[0];
    fVar58 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[2];
    fVar49 = (this->m_rbBFrame).m_origin.m_floats[0];
    fVar55 = (this->m_rbBFrame).m_origin.m_floats[1];
    fVar57 = (this->m_rbBFrame).m_origin.m_floats[2];
    _local_140 = stack0xfffffffffffffec4;
    btTransform::inverse(&this->m_rbAFrame);
    fVar23 = (float)local_170._40_4_ * fVar31 +
             (float)local_170._8_4_ * fVar21 + fVar41 * (float)local_170._24_4_;
    fVar28 = fStack_138 * fVar31 + (float)local_140._0_4_ * fVar21 + fVar41 * (float)local_140._4_4_
             + fVar56 * 0.0 + fVar48 * 0.0 + fVar50 * 0.0 + fVar57;
    fVar48 = (float)local_170._16_8_;
    fVar57 = SUB84(local_170._16_8_,4);
    fVar50 = (float)local_170._0_8_;
    fVar24 = SUB84(local_170._0_8_,4);
    fVar56 = (float)local_170._32_8_;
    fVar35 = SUB84(local_170._32_8_,4);
    fVar32 = fVar31 * fVar56 + fVar21 * fVar50 + fVar41 * fVar48;
    fVar21 = fVar31 * fVar35 + fVar21 * fVar24 + fVar41 * fVar57;
    fVar31 = local_b0.m_el[2].m_floats[0] * fVar38 +
             local_b0.m_el[0].m_floats[0] * fVar40 + local_b0.m_el[1].m_floats[0] * fVar43;
    fVar41 = local_b0.m_el[2].m_floats[0] * fVar58 +
             local_b0.m_el[0].m_floats[0] * fVar36 + local_b0.m_el[1].m_floats[0] * fVar45;
    fVar25 = local_b0.m_el[2].m_floats[1] * fVar38 +
             local_b0.m_el[0].m_floats[1] * fVar40 + local_b0.m_el[1].m_floats[1] * fVar43;
    fVar26 = local_b0.m_el[2].m_floats[1] * fVar58 +
             local_b0.m_el[0].m_floats[1] * fVar36 + local_b0.m_el[1].m_floats[1] * fVar45;
    fVar34 = local_b0.m_el[2].m_floats[2] * fVar38 +
             local_b0.m_el[0].m_floats[2] * fVar40 + local_b0.m_el[1].m_floats[2] * fVar43;
    fVar42 = local_b0.m_el[2].m_floats[2] * fVar58 +
             local_b0.m_el[0].m_floats[2] * fVar36 + local_b0.m_el[1].m_floats[2] * fVar45;
    local_248 = fStack_138 * fVar34 +
                (float)local_140._0_4_ * fVar31 + fVar25 * (float)local_140._4_4_ +
                fVar38 * 0.0 + fVar40 * 0.0 + fVar43 * 0.0 + fVar49;
    fVar38 = fStack_138 * fVar42 + (float)local_140._0_4_ * fVar41 + (float)local_140._4_4_ * fVar26
             + fVar58 * 0.0 + fVar36 * 0.0 + fVar45 * 0.0 + fVar55;
    local_f0.m_basis.m_el[0].m_floats[2] =
         fVar23 * local_130.m_basis.m_el[0].m_floats[2] +
         fVar32 * local_130.m_basis.m_el[0].m_floats[0] +
         fVar21 * local_130.m_basis.m_el[0].m_floats[1];
    local_f0.m_basis.m_el[1].m_floats[2] =
         fVar23 * local_130.m_basis.m_el[1].m_floats[2] +
         fVar32 * local_130.m_basis.m_el[1].m_floats[0] +
         fVar21 * local_130.m_basis.m_el[1].m_floats[1];
    local_f0.m_basis.m_el[2].m_floats[2] =
         fVar23 * local_130.m_basis.m_el[2].m_floats[2] +
         fVar32 * local_130.m_basis.m_el[2].m_floats[0] +
         fVar21 * local_130.m_basis.m_el[2].m_floats[1];
    fVar36 = (float)local_170._40_4_ * fVar34 +
             (float)local_170._8_4_ * fVar31 + (float)local_170._24_4_ * fVar25;
    fVar58 = (float)local_170._40_4_ * fVar42 +
             (float)local_170._8_4_ * fVar41 + (float)local_170._24_4_ * fVar26;
    fVar37 = fVar34 * fVar56 + fVar31 * fVar50 + fVar25 * fVar48;
    fVar43 = fVar34 * fVar35 + fVar31 * fVar24 + fVar25 * fVar57;
    fStack_230 = fVar34 * 0.0 + fVar31 * 0.0 + fVar25 * 0.0;
    fStack_22c = fVar34 * 0.0 + fVar31 * 0.0 + fVar25 * 0.0;
    fVar55 = fVar42 * fVar56 + fVar41 * fVar50 + fVar26 * fVar48;
    fVar57 = fVar42 * fVar35 + fVar41 * fVar24 + fVar26 * fVar57;
    local_170._8_4_ =
         fVar23 * local_70.m_basis.m_el[0].m_floats[2] +
         fVar36 * local_70.m_basis.m_el[0].m_floats[0] +
         fVar58 * local_70.m_basis.m_el[0].m_floats[1];
    uStack_244 = 0;
    uStack_240 = 0;
    uStack_23c = 0;
    fVar48 = -local_248;
    local_238 = fVar37 * fVar48;
    local_258 = fVar43 * fVar48;
    local_268 = ZEXT416((uint)fVar28);
    fVar49 = (fVar48 * fVar36 - fVar58 * fVar38) - fVar28 * fVar23;
    local_278 = local_70.m_basis.m_el[2].m_floats[0];
    uStack_274 = 0;
    uStack_270 = 0;
    uStack_26c = 0;
    local_170._24_4_ =
         fVar23 * local_70.m_basis.m_el[1].m_floats[2] +
         fVar36 * local_70.m_basis.m_el[1].m_floats[0] +
         fVar58 * local_70.m_basis.m_el[1].m_floats[1];
    local_170._40_4_ =
         local_70.m_basis.m_el[2].m_floats[2] * fVar23 +
         local_70.m_basis.m_el[2].m_floats[0] * fVar36 +
         local_70.m_basis.m_el[2].m_floats[1] * fVar58;
    fVar45 = (local_238 - fVar55 * fVar38) - fVar32 * fVar28;
    fVar48 = (local_258 - fVar57 * fVar38) - fVar21 * fVar28;
    fStack_354 = 0.0;
    fVar40 = fVar48 * local_130.m_basis.m_el[2].m_floats[1];
    fVar56 = fVar45 * local_130.m_basis.m_el[2].m_floats[0] + fVar40;
    local_170._12_4_ = 0.0;
    local_170._28_4_ = 0.0;
    local_170._44_4_ = 0.0;
    local_170._0_4_ =
         local_70.m_basis.m_el[0].m_floats[2] * fVar32 +
         local_70.m_basis.m_el[0].m_floats[0] * fVar37 +
         local_70.m_basis.m_el[0].m_floats[1] * fVar55;
    local_170._4_4_ =
         local_70.m_basis.m_el[0].m_floats[2] * fVar21 +
         local_70.m_basis.m_el[0].m_floats[0] * fVar43 +
         local_70.m_basis.m_el[0].m_floats[1] * fVar57;
    local_170._20_4_ =
         local_70.m_basis.m_el[1].m_floats[2] * fVar57 +
         local_70.m_basis.m_el[1].m_floats[0] * fVar43 +
         local_70.m_basis.m_el[1].m_floats[1] * fVar57;
    local_170._16_4_ =
         local_70.m_basis.m_el[1].m_floats[2] * fVar43 +
         local_70.m_basis.m_el[1].m_floats[0] * fVar37 +
         local_70.m_basis.m_el[1].m_floats[1] * fVar55;
    local_170._36_4_ =
         local_70.m_basis.m_el[2].m_floats[2] * fVar57 +
         local_70.m_basis.m_el[2].m_floats[0] * fVar43 +
         local_70.m_basis.m_el[2].m_floats[1] * fVar57;
    local_170._32_4_ =
         local_70.m_basis.m_el[2].m_floats[2] * fVar43 +
         local_70.m_basis.m_el[2].m_floats[0] * fVar37 +
         local_70.m_basis.m_el[2].m_floats[1] * fVar55;
    local_140._4_4_ =
         local_70.m_basis.m_el[1].m_floats[2] * fVar28 +
         local_70.m_basis.m_el[1].m_floats[0] * local_248 +
         local_70.m_basis.m_el[1].m_floats[1] * fVar38 + local_70.m_origin.m_floats[1];
    local_140._0_4_ =
         local_70.m_basis.m_el[0].m_floats[2] * fVar28 +
         local_70.m_basis.m_el[0].m_floats[0] * local_248 +
         local_70.m_basis.m_el[0].m_floats[1] * fVar38 + local_70.m_origin.m_floats[0];
    fStack_138 = fVar28 * local_70.m_basis.m_el[2].m_floats[2] +
                 local_248 * local_70.m_basis.m_el[2].m_floats[0] +
                 fVar38 * local_70.m_basis.m_el[2].m_floats[1] + local_70.m_origin.m_floats[2];
    unique0x1000010f = 0.0;
    fVar50 = fVar49 * local_130.m_basis.m_el[2].m_floats[2] + fVar56 +
             local_130.m_origin.m_floats[2];
    local_f0.m_basis.m_el[0].m_floats[1] =
         local_130.m_basis.m_el[0].m_floats[2] * fVar58 +
         local_130.m_basis.m_el[0].m_floats[0] * fVar55 +
         local_130.m_basis.m_el[0].m_floats[1] * fVar57;
    local_f0.m_basis.m_el[0].m_floats[0] =
         local_130.m_basis.m_el[0].m_floats[2] * fVar36 +
         local_130.m_basis.m_el[0].m_floats[0] * fVar37 +
         local_130.m_basis.m_el[0].m_floats[1] * fVar43;
    local_f0.m_basis.m_el[1].m_floats[0] =
         local_130.m_basis.m_el[1].m_floats[2] * fVar36 +
         local_130.m_basis.m_el[1].m_floats[0] * fVar37 +
         local_130.m_basis.m_el[1].m_floats[1] * fVar43;
    local_f0.m_basis.m_el[1].m_floats[1] =
         local_130.m_basis.m_el[1].m_floats[2] * fVar58 +
         local_130.m_basis.m_el[1].m_floats[0] * fVar55 +
         local_130.m_basis.m_el[1].m_floats[1] * fVar57;
    local_f0.m_basis.m_el[0].m_floats[3] = 0.0;
    local_f0.m_basis.m_el[2].m_floats[0] =
         local_130.m_basis.m_el[2].m_floats[2] * fVar36 +
         local_130.m_basis.m_el[2].m_floats[0] * fVar37 +
         local_130.m_basis.m_el[2].m_floats[1] * fVar43;
    local_f0.m_basis.m_el[2].m_floats[1] =
         local_130.m_basis.m_el[2].m_floats[2] * fVar58 +
         local_130.m_basis.m_el[2].m_floats[0] * fVar55 +
         local_130.m_basis.m_el[2].m_floats[1] * fVar57;
    local_f0.m_basis.m_el[1].m_floats[3] = 0.0;
    local_f0.m_basis.m_el[2].m_floats[3] = 0.0;
    local_f0.m_origin.m_floats[1] =
         local_130.m_basis.m_el[1].m_floats[2] * fVar49 +
         local_130.m_basis.m_el[1].m_floats[0] * fVar45 +
         local_130.m_basis.m_el[1].m_floats[1] * fVar48 + local_130.m_origin.m_floats[1];
    local_f0.m_origin.m_floats[0] =
         local_130.m_basis.m_el[0].m_floats[2] * fVar49 +
         local_130.m_basis.m_el[0].m_floats[0] * fVar45 +
         local_130.m_basis.m_el[0].m_floats[1] * fVar48 + local_130.m_origin.m_floats[0];
    local_f0.m_origin.m_floats[2] = fVar50;
    local_f0.m_origin.m_floats[3] = 0.0;
    bVar27 = local_130.m_basis.m_el[2].m_floats[1];
    fStack_254 = fVar43;
    fStack_250 = fVar43;
    fStack_24c = fVar43;
    fStack_234 = fVar43;
    btTransformUtil::calculateVelocity
              (&local_1b8,(btTransform *)local_170,timeStep,&local_298,&local_218);
    btTransformUtil::calculateVelocity(&local_1f8,&local_f0,timeStep,&local_298,&local_208);
    fVar45 = local_218.m_floats[0] - local_228.m_floats[0];
    fVar38 = local_218.m_floats[2] - local_228.m_floats[2];
    fVar36 = local_208.m_floats[0] - local_288.m_floats[0];
    fVar58 = local_218.m_floats[1] - local_228.m_floats[1];
    fVar49 = local_208.m_floats[1] - local_288.m_floats[1];
    fVar55 = local_208.m_floats[2] - local_288.m_floats[2];
    fVar48 = fVar38 * fVar38 + fVar45 * fVar45 + fVar58 * fVar58;
    fVar57 = 0.0;
    if (1.1920929e-07 < fVar48) {
      if (fVar48 < 0.0) {
        fVar48 = sqrtf(fVar48);
      }
      else {
        fVar48 = SQRT(fVar48);
      }
      fVar48 = 1.0 / fVar48;
      fVar40 = fVar45 * fVar48;
      fVar43 = fVar58 * fVar48;
      fVar50 = fVar48 * fVar38;
      pbVar15 = (this->super_btTypedConstraint).m_rbA;
      fVar57 = (*(float *)&pbVar15->field_0x174 * fVar50 +
               *(float *)&pbVar15->field_0x154 * fVar40 + *(float *)&pbVar15->field_0x164 * fVar43)
               * fVar50 +
               (*(float *)&pbVar15->field_0x16c * fVar50 +
               *(float *)&(pbVar15->super_btCollisionObject).field_0x14c * fVar40 +
               *(float *)&pbVar15->field_0x15c * fVar43) * fVar40 +
               (*(float *)&pbVar15->field_0x170 * fVar50 +
               *(float *)&pbVar15->field_0x150 * fVar40 + *(float *)&pbVar15->field_0x160 * fVar43)
               * fVar43;
    }
    fVar48 = fVar55 * fVar55 + fVar36 * fVar36 + fVar49 * fVar49;
    fVar23 = 0.0;
    if (1.1920929e-07 < fVar48) {
      if (fVar48 < 0.0) {
        fVar48 = sqrtf(fVar48);
      }
      else {
        fVar48 = SQRT(fVar48);
      }
      fVar48 = 1.0 / fVar48;
      bVar27 = fVar36 * fVar48;
      fStack_354 = fVar49 * fVar48;
      fVar56 = fVar48 * fVar55;
      pbVar15 = (this->super_btTypedConstraint).m_rbB;
      fVar23 = (*(float *)&pbVar15->field_0x174 * fVar56 +
               *(float *)&pbVar15->field_0x154 * bVar27 +
               *(float *)&pbVar15->field_0x164 * fStack_354) * fVar56 +
               (*(float *)&pbVar15->field_0x16c * fVar56 +
               *(float *)&(pbVar15->super_btCollisionObject).field_0x14c * bVar27 +
               *(float *)&pbVar15->field_0x15c * fStack_354) * bVar27 +
               (*(float *)&pbVar15->field_0x170 * fVar56 +
               *(float *)&pbVar15->field_0x150 * bVar27 +
               *(float *)&pbVar15->field_0x160 * fStack_354) * fStack_354;
    }
    fVar40 = fVar23 * bVar27 + fVar57 * fVar40;
    fVar43 = fStack_354 * fVar23 + fVar43 * fVar57;
    fVar50 = fVar56 * fVar23 + fVar50 * fVar57;
    fVar48 = fVar50 * fVar50 + fVar40 * fVar40 + fVar43 * fVar43;
    if (fVar48 <= 1.1920929e-07) goto LAB_0018ece1;
    if (fVar48 < 0.0) {
      fVar48 = sqrtf(fVar48);
    }
    else {
      fVar48 = SQRT(fVar48);
    }
    fVar48 = 1.0 / fVar48;
    fVar40 = fVar40 * fVar48;
    fVar43 = fVar43 * fVar48;
    fVar50 = fVar50 * fVar48;
    pbVar15 = (this->super_btTypedConstraint).m_rbA;
    pbVar16 = (this->super_btTypedConstraint).m_rbB;
    fVar48 = (*(float *)&pbVar15->field_0x174 * fVar50 +
             *(float *)&pbVar15->field_0x154 * fVar40 + *(float *)&pbVar15->field_0x164 * fVar43) *
             fVar50 + (*(float *)&pbVar15->field_0x16c * fVar50 +
                      *(float *)&(pbVar15->super_btCollisionObject).field_0x14c * fVar40 +
                      *(float *)&pbVar15->field_0x15c * fVar43) * fVar40 +
                      (*(float *)&pbVar15->field_0x170 * fVar50 +
                      *(float *)&pbVar15->field_0x150 * fVar40 +
                      *(float *)&pbVar15->field_0x160 * fVar43) * fVar43;
    fVar50 = (*(float *)&pbVar16->field_0x174 * fVar50 +
             *(float *)&pbVar16->field_0x154 * fVar40 + *(float *)&pbVar16->field_0x164 * fVar43) *
             fVar50 + (*(float *)&pbVar16->field_0x16c * fVar50 +
                      *(float *)&(pbVar16->super_btCollisionObject).field_0x14c * fVar40 +
                      *(float *)&pbVar16->field_0x15c * fVar43) * fVar40 +
                      (*(float *)&pbVar16->field_0x170 * fVar50 +
                      *(float *)&pbVar16->field_0x150 * fVar40 +
                      *(float *)&pbVar16->field_0x160 * fVar43) * fVar43;
    fVar40 = 1.0 / ((fVar48 + fVar50) * (fVar48 + fVar50));
    fVar56 = (fVar38 * fVar48 - fVar55 * fVar50) * fVar40;
    fVar43 = fVar40 * (fVar45 * fVar48 - fVar36 * fVar50);
    fVar40 = fVar40 * (fVar58 * fVar48 - fVar49 * fVar50);
    if (0.0 <= this->m_maxMotorImpulse) {
      fVar50 = 1.0;
      if (this->m_bNormalizedMotorStrength != false) {
        fVar50 = fVar48;
      }
      fVar50 = this->m_maxMotorImpulse / fVar50;
      uVar11 = *(undefined8 *)(this->m_accMotorImpulse).m_floats;
      fVar38 = (float)uVar11 + fVar43;
      fVar45 = (float)((ulong)uVar11 >> 0x20) + fVar40;
      fVar36 = fVar56 + (this->m_accMotorImpulse).m_floats[2];
      fVar48 = fVar36 * fVar36 + fVar38 * fVar38 + fVar45 * fVar45;
      if (fVar48 < 0.0) {
        fVar58 = sqrtf(fVar48);
      }
      else {
        fVar58 = SQRT(fVar48);
      }
      if (fVar50 < fVar58) {
        if (fVar48 < 0.0) {
          fVar48 = sqrtf(fVar48);
        }
        else {
          fVar48 = SQRT(fVar48);
        }
        fVar48 = 1.0 / fVar48;
        uVar11 = *(undefined8 *)(this->m_accMotorImpulse).m_floats;
        fVar56 = fVar36 * fVar48 * fVar50 - (this->m_accMotorImpulse).m_floats[2];
        fVar43 = fVar50 * fVar38 * fVar48 - (float)uVar11;
        fVar40 = fVar50 * fVar45 * fVar48 - (float)((ulong)uVar11 >> 0x20);
      }
      uVar11 = *(undefined8 *)(this->m_accMotorImpulse).m_floats;
      *(ulong *)(this->m_accMotorImpulse).m_floats =
           CONCAT44((float)((ulong)uVar11 >> 0x20) + fVar40,(float)uVar11 + fVar43);
      (this->m_accMotorImpulse).m_floats[2] = (this->m_accMotorImpulse).m_floats[2] + fVar56;
    }
    fVar48 = fVar56 * fVar56 + fVar43 * fVar43 + fVar40 * fVar40;
    if (fVar48 < 0.0) {
      fVar48 = sqrtf(fVar48);
    }
    else {
      fVar48 = SQRT(fVar48);
    }
    fVar50 = 1.0 / fVar48;
    fVar43 = fVar43 * fVar50;
    fVar40 = fVar40 * fVar50;
    fVar50 = fVar50 * fVar56;
    if (bodyA->m_originalBody != (btRigidBody *)0x0) {
      pbVar15 = (this->super_btTypedConstraint).m_rbA;
      fVar56 = *(float *)&pbVar15->field_0x170;
      fVar38 = *(float *)&pbVar15->field_0x16c;
      fVar45 = *(float *)&pbVar15->field_0x174;
      fVar35 = fVar48 * 0.0;
      fVar36 = (bodyA->m_linearFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyA->m_deltaLinearVelocity).m_floats;
      uVar12 = *(undefined8 *)(bodyA->m_deltaAngularVelocity).m_floats;
      uVar13 = *(undefined8 *)(bodyA->m_angularFactor).m_floats;
      uVar14 = *(undefined8 *)(bodyA->m_linearFactor).m_floats;
      fVar58 = *(float *)&pbVar15->field_0x160;
      fVar49 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
      fVar55 = *(float *)&pbVar15->field_0x150;
      fVar57 = *(float *)&pbVar15->field_0x154;
      fVar23 = *(float *)&pbVar15->field_0x15c;
      fVar24 = *(float *)&pbVar15->field_0x164;
      *(ulong *)(bodyA->m_deltaLinearVelocity).m_floats =
           CONCAT44(fVar35 * (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                    fVar35 * (float)uVar14 + (float)uVar11);
      (bodyA->m_deltaLinearVelocity).m_floats[2] =
           fVar36 * fVar35 + (bodyA->m_deltaLinearVelocity).m_floats[2];
      fVar36 = (bodyA->m_angularFactor).m_floats[2];
      *(ulong *)(bodyA->m_deltaAngularVelocity).m_floats =
           CONCAT44(fVar48 * (float)((ulong)uVar13 >> 0x20) *
                    (fVar50 * fVar24 + fVar43 * fVar23 + fVar40 * fVar58) +
                    (float)((ulong)uVar12 >> 0x20),
                    fVar48 * (float)uVar13 * (fVar50 * fVar57 + fVar43 * fVar49 + fVar40 * fVar55) +
                    (float)uVar12);
      (bodyA->m_deltaAngularVelocity).m_floats[2] =
           fVar36 * fVar48 * (fVar45 * fVar50 + fVar38 * fVar43 + fVar56 * fVar40) +
           (bodyA->m_deltaAngularVelocity).m_floats[2];
    }
    if (bodyB->m_originalBody == (btRigidBody *)0x0) goto LAB_0018ece1;
    pbVar15 = (this->super_btTypedConstraint).m_rbB;
    fVar56 = *(float *)&pbVar15->field_0x170;
    fVar38 = *(float *)&pbVar15->field_0x16c;
    fVar45 = *(float *)&pbVar15->field_0x174;
    fVar35 = fVar48 * -0.0;
    fVar36 = (bodyB->m_linearFactor).m_floats[2];
    uVar11 = *(undefined8 *)(bodyB->m_deltaLinearVelocity).m_floats;
    uVar12 = *(undefined8 *)(bodyB->m_deltaAngularVelocity).m_floats;
    uVar13 = *(undefined8 *)(bodyB->m_angularFactor).m_floats;
    uVar14 = *(undefined8 *)(bodyB->m_linearFactor).m_floats;
    fVar58 = *(float *)&pbVar15->field_0x160;
    fVar49 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
    fVar55 = *(float *)&pbVar15->field_0x150;
    fVar57 = *(float *)&pbVar15->field_0x154;
    fVar23 = *(float *)&pbVar15->field_0x15c;
    fVar24 = *(float *)&pbVar15->field_0x164;
    *(ulong *)(bodyB->m_deltaLinearVelocity).m_floats =
         CONCAT44(fVar35 * (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                  fVar35 * (float)uVar14 + (float)uVar11);
    (bodyB->m_deltaLinearVelocity).m_floats[2] =
         fVar36 * fVar35 + (bodyB->m_deltaLinearVelocity).m_floats[2];
    fVar36 = (bodyB->m_angularFactor).m_floats[2];
    *(ulong *)(bodyB->m_deltaAngularVelocity).m_floats =
         CONCAT44((float)((ulong)uVar12 >> 0x20) -
                  fVar48 * (float)((ulong)uVar13 >> 0x20) *
                  (fVar50 * fVar24 + fVar43 * fVar23 + fVar40 * fVar58),
                  (float)uVar12 -
                  fVar48 * (float)uVar13 * (fVar50 * fVar57 + fVar43 * fVar49 + fVar40 * fVar55));
    bVar27 = (bodyB->m_deltaAngularVelocity).m_floats[2] -
             fVar36 * fVar48 * (fVar45 * fVar50 + fVar38 * fVar43 + fVar56 * fVar40);
  }
  else {
    if (this->m_damping <= 1.1920929e-07) goto LAB_0018ece1;
    fVar56 = ((bodyB->m_angularVelocity).m_floats[0] + (bodyB->m_deltaAngularVelocity).m_floats[0])
             - ((bodyA->m_angularVelocity).m_floats[0] + (bodyA->m_deltaAngularVelocity).m_floats[0]
               );
    fVar43 = ((bodyB->m_angularVelocity).m_floats[1] + (bodyB->m_deltaAngularVelocity).m_floats[1])
             - ((bodyA->m_angularVelocity).m_floats[1] + (bodyA->m_deltaAngularVelocity).m_floats[1]
               );
    fVar50 = ((bodyB->m_angularVelocity).m_floats[2] + (bodyB->m_deltaAngularVelocity).m_floats[2])
             - ((bodyA->m_angularVelocity).m_floats[2] + (bodyA->m_deltaAngularVelocity).m_floats[2]
               );
    fVar48 = fVar50 * fVar50 + fVar56 * fVar56 + fVar43 * fVar43;
    if (fVar48 <= 1.1920929e-07) goto LAB_0018ece1;
    if (fVar48 < 0.0) {
      fVar48 = sqrtf(fVar48);
    }
    else {
      fVar48 = SQRT(fVar48);
    }
    fVar48 = 1.0 / fVar48;
    fVar40 = fVar56 * fVar48;
    fVar38 = fVar43 * fVar48;
    fVar48 = fVar48 * fVar50;
    pbVar15 = (this->super_btTypedConstraint).m_rbA;
    pbVar16 = (this->super_btTypedConstraint).m_rbB;
    fVar40 = (1.0 / ((*(float *)&pbVar16->field_0x174 * fVar48 +
                     *(float *)&pbVar16->field_0x154 * fVar40 +
                     *(float *)&pbVar16->field_0x164 * fVar38) * fVar48 +
                     (*(float *)&pbVar16->field_0x16c * fVar48 +
                     *(float *)&(pbVar16->super_btCollisionObject).field_0x14c * fVar40 +
                     *(float *)&pbVar16->field_0x15c * fVar38) * fVar40 +
                     (*(float *)&pbVar16->field_0x170 * fVar48 +
                     *(float *)&pbVar16->field_0x150 * fVar40 +
                     *(float *)&pbVar16->field_0x160 * fVar38) * fVar38 +
                    (*(float *)&pbVar15->field_0x174 * fVar48 +
                    *(float *)&pbVar15->field_0x154 * fVar40 +
                    *(float *)&pbVar15->field_0x164 * fVar38) * fVar48 +
                    (*(float *)&pbVar15->field_0x16c * fVar48 +
                    *(float *)&(pbVar15->super_btCollisionObject).field_0x14c * fVar40 +
                    *(float *)&pbVar15->field_0x15c * fVar38) * fVar40 +
                    (*(float *)&pbVar15->field_0x170 * fVar48 +
                    *(float *)&pbVar15->field_0x150 * fVar40 +
                    *(float *)&pbVar15->field_0x160 * fVar38) * fVar38)) * this->m_damping;
    fVar56 = fVar56 * fVar40;
    fVar43 = fVar43 * fVar40;
    fVar40 = fVar40 * fVar50;
    fVar48 = fVar40 * fVar40 + fVar56 * fVar56 + fVar43 * fVar43;
    if (fVar48 < 0.0) {
      fVar48 = sqrtf(fVar48);
    }
    else {
      fVar48 = SQRT(fVar48);
    }
    fVar50 = 1.0 / fVar48;
    fVar56 = fVar56 * fVar50;
    fVar43 = fVar43 * fVar50;
    fVar50 = fVar50 * fVar40;
    if (bodyA->m_originalBody != (btRigidBody *)0x0) {
      pbVar15 = (this->super_btTypedConstraint).m_rbA;
      fVar40 = *(float *)&pbVar15->field_0x170;
      fVar38 = *(float *)&pbVar15->field_0x16c;
      fVar45 = *(float *)&pbVar15->field_0x174;
      fVar35 = fVar48 * 0.0;
      fVar36 = (bodyA->m_linearFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyA->m_deltaLinearVelocity).m_floats;
      uVar12 = *(undefined8 *)(bodyA->m_deltaAngularVelocity).m_floats;
      uVar13 = *(undefined8 *)(bodyA->m_angularFactor).m_floats;
      uVar14 = *(undefined8 *)(bodyA->m_linearFactor).m_floats;
      fVar58 = *(float *)&pbVar15->field_0x160;
      fVar49 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
      fVar55 = *(float *)&pbVar15->field_0x150;
      fVar57 = *(float *)&pbVar15->field_0x154;
      fVar23 = *(float *)&pbVar15->field_0x15c;
      fVar24 = *(float *)&pbVar15->field_0x164;
      *(ulong *)(bodyA->m_deltaLinearVelocity).m_floats =
           CONCAT44(fVar35 * (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                    fVar35 * (float)uVar14 + (float)uVar11);
      (bodyA->m_deltaLinearVelocity).m_floats[2] =
           fVar36 * fVar35 + (bodyA->m_deltaLinearVelocity).m_floats[2];
      fVar36 = (bodyA->m_angularFactor).m_floats[2];
      *(ulong *)(bodyA->m_deltaAngularVelocity).m_floats =
           CONCAT44(fVar48 * (float)((ulong)uVar13 >> 0x20) *
                    (fVar50 * fVar24 + fVar56 * fVar23 + fVar43 * fVar58) +
                    (float)((ulong)uVar12 >> 0x20),
                    fVar48 * (float)uVar13 * (fVar50 * fVar57 + fVar56 * fVar49 + fVar43 * fVar55) +
                    (float)uVar12);
      (bodyA->m_deltaAngularVelocity).m_floats[2] =
           fVar36 * fVar48 * (fVar45 * fVar50 + fVar38 * fVar56 + fVar40 * fVar43) +
           (bodyA->m_deltaAngularVelocity).m_floats[2];
    }
    if (bodyB->m_originalBody == (btRigidBody *)0x0) goto LAB_0018ece1;
    pbVar15 = (this->super_btTypedConstraint).m_rbB;
    fVar40 = *(float *)&pbVar15->field_0x170;
    fVar38 = *(float *)&pbVar15->field_0x16c;
    fVar45 = *(float *)&pbVar15->field_0x174;
    fVar35 = fVar48 * -0.0;
    fVar36 = (bodyB->m_linearFactor).m_floats[2];
    uVar11 = *(undefined8 *)(bodyB->m_deltaLinearVelocity).m_floats;
    uVar12 = *(undefined8 *)(bodyB->m_deltaAngularVelocity).m_floats;
    uVar13 = *(undefined8 *)(bodyB->m_angularFactor).m_floats;
    uVar14 = *(undefined8 *)(bodyB->m_linearFactor).m_floats;
    fVar58 = *(float *)&pbVar15->field_0x160;
    fVar49 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
    fVar55 = *(float *)&pbVar15->field_0x150;
    fVar57 = *(float *)&pbVar15->field_0x154;
    fVar23 = *(float *)&pbVar15->field_0x15c;
    fVar24 = *(float *)&pbVar15->field_0x164;
    *(ulong *)(bodyB->m_deltaLinearVelocity).m_floats =
         CONCAT44(fVar35 * (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                  fVar35 * (float)uVar14 + (float)uVar11);
    (bodyB->m_deltaLinearVelocity).m_floats[2] =
         fVar36 * fVar35 + (bodyB->m_deltaLinearVelocity).m_floats[2];
    fVar36 = (bodyB->m_angularFactor).m_floats[2];
    *(ulong *)(bodyB->m_deltaAngularVelocity).m_floats =
         CONCAT44((float)((ulong)uVar12 >> 0x20) -
                  fVar48 * (float)((ulong)uVar13 >> 0x20) *
                  (fVar50 * fVar24 + fVar56 * fVar23 + fVar43 * fVar58),
                  (float)uVar12 -
                  fVar48 * (float)uVar13 * (fVar50 * fVar57 + fVar56 * fVar49 + fVar43 * fVar55));
    bVar27 = (bodyB->m_deltaAngularVelocity).m_floats[2] -
             fVar36 * fVar48 * (fVar45 * fVar50 + fVar38 * fVar56 + fVar40 * fVar43);
  }
  (bodyB->m_deltaAngularVelocity).m_floats[2] = bVar27;
LAB_0018ece1:
  fVar50 = (bodyA->m_angularVelocity).m_floats[0] + (bodyA->m_deltaAngularVelocity).m_floats[0];
  fVar48 = (bodyA->m_angularVelocity).m_floats[1] + (bodyA->m_deltaAngularVelocity).m_floats[1];
  fVar56 = (bodyA->m_angularVelocity).m_floats[2] + (bodyA->m_deltaAngularVelocity).m_floats[2];
  fVar40 = (bodyB->m_angularVelocity).m_floats[0] + (bodyB->m_deltaAngularVelocity).m_floats[0];
  fVar38 = (bodyB->m_angularVelocity).m_floats[1] + (bodyB->m_deltaAngularVelocity).m_floats[1];
  fVar43 = (bodyB->m_angularVelocity).m_floats[2] + (bodyB->m_deltaAngularVelocity).m_floats[2];
  if (this->m_solveSwingLimit == true) {
    fVar55 = (this->m_swingCorrection * this->m_swingLimitRatio * this->m_biasFactor) / timeStep;
    fVar45 = (this->m_swingAxis).m_floats[0];
    fVar36 = (this->m_swingAxis).m_floats[1];
    fVar58 = (this->m_swingAxis).m_floats[2];
    fVar57 = (fVar43 - fVar56) * fVar58 + (fVar40 - fVar50) * fVar45 + (fVar38 - fVar48) * fVar36;
    uVar20 = -(uint)(0.0 < fVar57);
    fVar49 = this->m_accSwingLimitImpulse;
    fVar55 = (float)(~uVar20 & (uint)fVar55 |
                    (uint)(this->m_swingLimitRatio * fVar57 * this->m_relaxationFactor + fVar55) &
                    uVar20) * this->m_kSwing + fVar49;
    if (fVar55 <= 0.0) {
      fVar55 = 0.0;
    }
    this->m_accSwingLimitImpulse = fVar55;
    fVar55 = fVar55 - fVar49;
    fVar45 = fVar45 * fVar55;
    fVar36 = fVar36 * fVar55;
    fVar55 = fVar55 * fVar58;
    fVar58 = (this->m_twistAxisA).m_floats[0];
    fVar49 = (this->m_twistAxisA).m_floats[1];
    fVar57 = (this->m_twistAxisA).m_floats[2];
    fVar23 = fVar55 * fVar57 + fVar45 * fVar58 + fVar49 * fVar36;
    fVar45 = fVar45 - fVar58 * fVar23;
    fVar36 = fVar36 - fVar49 * fVar23;
    fVar55 = fVar55 - fVar23 * fVar57;
    fVar58 = fVar55 * fVar55 + fVar45 * fVar45 + fVar36 * fVar36;
    if (fVar58 < 0.0) {
      fVar58 = sqrtf(fVar58);
    }
    else {
      fVar58 = SQRT(fVar58);
    }
    fVar49 = 1.0 / fVar58;
    fVar45 = fVar45 * fVar49;
    fVar36 = fVar36 * fVar49;
    fVar49 = fVar49 * fVar55;
    if (bodyA->m_originalBody != (btRigidBody *)0x0) {
      pbVar15 = (this->super_btTypedConstraint).m_rbA;
      fVar55 = *(float *)&pbVar15->field_0x170;
      fVar57 = *(float *)&pbVar15->field_0x16c;
      fVar23 = *(float *)&pbVar15->field_0x174;
      fVar26 = fVar58 * 0.0;
      fVar24 = (bodyA->m_linearFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyA->m_deltaLinearVelocity).m_floats;
      uVar12 = *(undefined8 *)(bodyA->m_deltaAngularVelocity).m_floats;
      uVar13 = *(undefined8 *)(bodyA->m_angularFactor).m_floats;
      uVar14 = *(undefined8 *)(bodyA->m_linearFactor).m_floats;
      fVar35 = *(float *)&pbVar15->field_0x160;
      fVar31 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
      fVar41 = *(float *)&pbVar15->field_0x150;
      fVar32 = *(float *)&pbVar15->field_0x154;
      fVar21 = *(float *)&pbVar15->field_0x15c;
      fVar25 = *(float *)&pbVar15->field_0x164;
      *(ulong *)(bodyA->m_deltaLinearVelocity).m_floats =
           CONCAT44(fVar26 * (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                    fVar26 * (float)uVar14 + (float)uVar11);
      (bodyA->m_deltaLinearVelocity).m_floats[2] =
           fVar24 * fVar26 + (bodyA->m_deltaLinearVelocity).m_floats[2];
      fVar24 = (bodyA->m_angularFactor).m_floats[2];
      *(ulong *)(bodyA->m_deltaAngularVelocity).m_floats =
           CONCAT44(fVar58 * (float)((ulong)uVar13 >> 0x20) *
                    (fVar49 * fVar25 + fVar45 * fVar21 + fVar36 * fVar35) +
                    (float)((ulong)uVar12 >> 0x20),
                    fVar58 * (float)uVar13 * (fVar49 * fVar32 + fVar45 * fVar31 + fVar36 * fVar41) +
                    (float)uVar12);
      (bodyA->m_deltaAngularVelocity).m_floats[2] =
           fVar24 * fVar58 * (fVar23 * fVar49 + fVar57 * fVar45 + fVar55 * fVar36) +
           (bodyA->m_deltaAngularVelocity).m_floats[2];
    }
    if (bodyB->m_originalBody != (btRigidBody *)0x0) {
      pbVar15 = (this->super_btTypedConstraint).m_rbB;
      fVar55 = *(float *)&pbVar15->field_0x170;
      fVar57 = *(float *)&pbVar15->field_0x16c;
      fVar23 = *(float *)&pbVar15->field_0x174;
      fVar26 = fVar58 * -0.0;
      fVar24 = (bodyB->m_linearFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyB->m_deltaLinearVelocity).m_floats;
      uVar12 = *(undefined8 *)(bodyB->m_deltaAngularVelocity).m_floats;
      uVar13 = *(undefined8 *)(bodyB->m_angularFactor).m_floats;
      uVar14 = *(undefined8 *)(bodyB->m_linearFactor).m_floats;
      fVar35 = *(float *)&pbVar15->field_0x160;
      fVar31 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
      fVar41 = *(float *)&pbVar15->field_0x150;
      fVar32 = *(float *)&pbVar15->field_0x154;
      fVar21 = *(float *)&pbVar15->field_0x15c;
      fVar25 = *(float *)&pbVar15->field_0x164;
      *(ulong *)(bodyB->m_deltaLinearVelocity).m_floats =
           CONCAT44(fVar26 * (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                    fVar26 * (float)uVar14 + (float)uVar11);
      (bodyB->m_deltaLinearVelocity).m_floats[2] =
           fVar24 * fVar26 + (bodyB->m_deltaLinearVelocity).m_floats[2];
      fVar24 = (bodyB->m_angularFactor).m_floats[2];
      *(ulong *)(bodyB->m_deltaAngularVelocity).m_floats =
           CONCAT44((float)((ulong)uVar12 >> 0x20) -
                    fVar58 * (float)((ulong)uVar13 >> 0x20) *
                    (fVar49 * fVar25 + fVar45 * fVar21 + fVar36 * fVar35),
                    (float)uVar12 -
                    fVar58 * (float)uVar13 * (fVar49 * fVar32 + fVar45 * fVar31 + fVar36 * fVar41));
      (bodyB->m_deltaAngularVelocity).m_floats[2] =
           (bodyB->m_deltaAngularVelocity).m_floats[2] -
           fVar24 * fVar58 * (fVar23 * fVar49 + fVar57 * fVar45 + fVar55 * fVar36);
    }
  }
  if (this->m_solveTwistLimit == true) {
    fVar49 = (this->m_twistCorrection * this->m_twistLimitRatio * this->m_biasFactor) / timeStep;
    fVar45 = (this->m_twistAxis).m_floats[0];
    fVar36 = (this->m_twistAxis).m_floats[1];
    fVar58 = (this->m_twistAxis).m_floats[2];
    fVar50 = (fVar43 - fVar56) * fVar58 + (fVar40 - fVar50) * fVar45 + (fVar38 - fVar48) * fVar36;
    uVar20 = -(uint)(0.0 < fVar50);
    fVar48 = this->m_accTwistLimitImpulse;
    fVar50 = (float)(~uVar20 & (uint)fVar49 |
                    (uint)(this->m_twistLimitRatio * fVar50 * this->m_relaxationFactor + fVar49) &
                    uVar20) * this->m_kTwist + fVar48;
    if (fVar50 <= 0.0) {
      fVar50 = 0.0;
    }
    this->m_accTwistLimitImpulse = fVar50;
    fVar50 = fVar50 - fVar48;
    if (bodyA->m_originalBody != (btRigidBody *)0x0) {
      pbVar15 = (this->super_btTypedConstraint).m_rbA;
      fVar48 = *(float *)&pbVar15->field_0x170;
      fVar56 = *(float *)&pbVar15->field_0x16c;
      fVar43 = *(float *)&pbVar15->field_0x174;
      fVar35 = fVar50 * 0.0;
      fVar40 = (bodyA->m_linearFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyA->m_deltaLinearVelocity).m_floats;
      uVar12 = *(undefined8 *)(bodyA->m_deltaAngularVelocity).m_floats;
      uVar13 = *(undefined8 *)(bodyA->m_angularFactor).m_floats;
      uVar14 = *(undefined8 *)(bodyA->m_linearFactor).m_floats;
      fVar38 = *(float *)&pbVar15->field_0x160;
      fVar49 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
      fVar55 = *(float *)&pbVar15->field_0x150;
      fVar57 = *(float *)&pbVar15->field_0x154;
      fVar23 = *(float *)&pbVar15->field_0x15c;
      fVar24 = *(float *)&pbVar15->field_0x164;
      *(ulong *)(bodyA->m_deltaLinearVelocity).m_floats =
           CONCAT44(fVar35 * (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                    fVar35 * (float)uVar14 + (float)uVar11);
      (bodyA->m_deltaLinearVelocity).m_floats[2] =
           fVar40 * fVar35 + (bodyA->m_deltaLinearVelocity).m_floats[2];
      fVar40 = (bodyA->m_angularFactor).m_floats[2];
      *(ulong *)(bodyA->m_deltaAngularVelocity).m_floats =
           CONCAT44(fVar50 * (float)((ulong)uVar13 >> 0x20) *
                    (fVar58 * fVar24 + fVar45 * fVar23 + fVar36 * fVar38) +
                    (float)((ulong)uVar12 >> 0x20),
                    fVar50 * (float)uVar13 * (fVar58 * fVar57 + fVar45 * fVar49 + fVar36 * fVar55) +
                    (float)uVar12);
      (bodyA->m_deltaAngularVelocity).m_floats[2] =
           fVar40 * fVar50 * (fVar43 * fVar58 + fVar56 * fVar45 + fVar48 * fVar36) +
           (bodyA->m_deltaAngularVelocity).m_floats[2];
    }
    if (bodyB->m_originalBody != (btRigidBody *)0x0) {
      pbVar15 = (this->super_btTypedConstraint).m_rbB;
      fVar48 = (this->m_twistAxis).m_floats[2];
      fVar56 = (this->m_twistAxis).m_floats[0];
      fVar43 = (this->m_twistAxis).m_floats[1];
      fVar40 = *(float *)&pbVar15->field_0x170;
      fVar38 = *(float *)&pbVar15->field_0x16c;
      fVar45 = *(float *)&pbVar15->field_0x174;
      fVar35 = fVar50 * -0.0;
      fVar36 = (bodyB->m_linearFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyB->m_deltaLinearVelocity).m_floats;
      uVar12 = *(undefined8 *)(bodyB->m_linearFactor).m_floats;
      fVar58 = *(float *)&pbVar15->field_0x160;
      fVar49 = *(float *)&(pbVar15->super_btCollisionObject).field_0x14c;
      fVar55 = *(float *)&pbVar15->field_0x150;
      fVar57 = *(float *)&pbVar15->field_0x154;
      fVar23 = *(float *)&pbVar15->field_0x15c;
      fVar24 = *(float *)&pbVar15->field_0x164;
      *(ulong *)(bodyB->m_deltaLinearVelocity).m_floats =
           CONCAT44(fVar35 * (float)((ulong)uVar12 >> 0x20) + (float)((ulong)uVar11 >> 0x20),
                    fVar35 * (float)uVar12 + (float)uVar11);
      (bodyB->m_deltaLinearVelocity).m_floats[2] =
           fVar36 * fVar35 + (bodyB->m_deltaLinearVelocity).m_floats[2];
      fVar36 = (bodyB->m_angularFactor).m_floats[2];
      uVar11 = *(undefined8 *)(bodyB->m_deltaAngularVelocity).m_floats;
      uVar12 = *(undefined8 *)(bodyB->m_angularFactor).m_floats;
      *(ulong *)(bodyB->m_deltaAngularVelocity).m_floats =
           CONCAT44((float)((ulong)uVar11 >> 0x20) -
                    fVar50 * (float)((ulong)uVar12 >> 0x20) *
                    (fVar48 * fVar24 + fVar56 * fVar23 + fVar43 * fVar58),
                    (float)uVar11 -
                    fVar50 * (float)uVar12 * (fVar48 * fVar57 + fVar56 * fVar49 + fVar43 * fVar55));
      (bodyB->m_deltaAngularVelocity).m_floats[2] =
           (bodyB->m_deltaAngularVelocity).m_floats[2] -
           fVar36 * fVar50 * (fVar45 * fVar48 + fVar38 * fVar56 + fVar40 * fVar43);
    }
  }
  return;
}

Assistant:

void	btConeTwistConstraint::solveConstraintObsolete(btSolverBody& bodyA,btSolverBody& bodyB,btScalar	timeStep)
{
	#ifndef __SPU__
	if (m_useSolveConstraintObsolete)
	{
		btVector3 pivotAInW = m_rbA.getCenterOfMassTransform()*m_rbAFrame.getOrigin();
		btVector3 pivotBInW = m_rbB.getCenterOfMassTransform()*m_rbBFrame.getOrigin();

		btScalar tau = btScalar(0.3);

		//linear part
		if (!m_angularOnly)
		{
			btVector3 rel_pos1 = pivotAInW - m_rbA.getCenterOfMassPosition(); 
			btVector3 rel_pos2 = pivotBInW - m_rbB.getCenterOfMassPosition();

			btVector3 vel1;
			bodyA.internalGetVelocityInLocalPointObsolete(rel_pos1,vel1);
			btVector3 vel2;
			bodyB.internalGetVelocityInLocalPointObsolete(rel_pos2,vel2);
			btVector3 vel = vel1 - vel2;

			for (int i=0;i<3;i++)
			{		
				const btVector3& normal = m_jac[i].m_linearJointAxis;
				btScalar jacDiagABInv = btScalar(1.) / m_jac[i].getDiagonal();

				btScalar rel_vel;
				rel_vel = normal.dot(vel);
				//positional error (zeroth order error)
				btScalar depth = -(pivotAInW - pivotBInW).dot(normal); //this is the error projected on the normal
				btScalar impulse = depth*tau/timeStep  * jacDiagABInv -  rel_vel * jacDiagABInv;
				m_appliedImpulse += impulse;
				
				btVector3 ftorqueAxis1 = rel_pos1.cross(normal);
				btVector3 ftorqueAxis2 = rel_pos2.cross(normal);
				bodyA.internalApplyImpulse(normal*m_rbA.getInvMass(), m_rbA.getInvInertiaTensorWorld()*ftorqueAxis1,impulse);
				bodyB.internalApplyImpulse(normal*m_rbB.getInvMass(), m_rbB.getInvInertiaTensorWorld()*ftorqueAxis2,-impulse);
		
			}
		}

		// apply motor
		if (m_bMotorEnabled)
		{
			// compute current and predicted transforms
			btTransform trACur = m_rbA.getCenterOfMassTransform();
			btTransform trBCur = m_rbB.getCenterOfMassTransform();
			btVector3 omegaA; bodyA.internalGetAngularVelocity(omegaA);
			btVector3 omegaB; bodyB.internalGetAngularVelocity(omegaB);
			btTransform trAPred; trAPred.setIdentity(); 
			btVector3 zerovec(0,0,0);
			btTransformUtil::integrateTransform(
				trACur, zerovec, omegaA, timeStep, trAPred);
			btTransform trBPred; trBPred.setIdentity(); 
			btTransformUtil::integrateTransform(
				trBCur, zerovec, omegaB, timeStep, trBPred);

			// compute desired transforms in world
			btTransform trPose(m_qTarget);
			btTransform trABDes = m_rbBFrame * trPose * m_rbAFrame.inverse();
			btTransform trADes = trBPred * trABDes;
			btTransform trBDes = trAPred * trABDes.inverse();

			// compute desired omegas in world
			btVector3 omegaADes, omegaBDes;
			
			btTransformUtil::calculateVelocity(trACur, trADes, timeStep, zerovec, omegaADes);
			btTransformUtil::calculateVelocity(trBCur, trBDes, timeStep, zerovec, omegaBDes);

			// compute delta omegas
			btVector3 dOmegaA = omegaADes - omegaA;
			btVector3 dOmegaB = omegaBDes - omegaB;

			// compute weighted avg axis of dOmega (weighting based on inertias)
			btVector3 axisA, axisB;
			btScalar kAxisAInv = 0, kAxisBInv = 0;

			if (dOmegaA.length2() > SIMD_EPSILON)
			{
				axisA = dOmegaA.normalized();
				kAxisAInv = getRigidBodyA().computeAngularImpulseDenominator(axisA);
			}

			if (dOmegaB.length2() > SIMD_EPSILON)
			{
				axisB = dOmegaB.normalized();
				kAxisBInv = getRigidBodyB().computeAngularImpulseDenominator(axisB);
			}

			btVector3 avgAxis = kAxisAInv * axisA + kAxisBInv * axisB;

			static bool bDoTorque = true;
			if (bDoTorque && avgAxis.length2() > SIMD_EPSILON)
			{
				avgAxis.normalize();
				kAxisAInv = getRigidBodyA().computeAngularImpulseDenominator(avgAxis);
				kAxisBInv = getRigidBodyB().computeAngularImpulseDenominator(avgAxis);
				btScalar kInvCombined = kAxisAInv + kAxisBInv;

				btVector3 impulse = (kAxisAInv * dOmegaA - kAxisBInv * dOmegaB) /
									(kInvCombined * kInvCombined);

				if (m_maxMotorImpulse >= 0)
				{
					btScalar fMaxImpulse = m_maxMotorImpulse;
					if (m_bNormalizedMotorStrength)
						fMaxImpulse = fMaxImpulse/kAxisAInv;

					btVector3 newUnclampedAccImpulse = m_accMotorImpulse + impulse;
					btScalar  newUnclampedMag = newUnclampedAccImpulse.length();
					if (newUnclampedMag > fMaxImpulse)
					{
						newUnclampedAccImpulse.normalize();
						newUnclampedAccImpulse *= fMaxImpulse;
						impulse = newUnclampedAccImpulse - m_accMotorImpulse;
					}
					m_accMotorImpulse += impulse;
				}

				btScalar  impulseMag  = impulse.length();
				btVector3 impulseAxis =  impulse / impulseMag;

				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*impulseAxis, impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*impulseAxis, -impulseMag);

			}
		}
		else if (m_damping > SIMD_EPSILON) // no motor: do a little damping
		{
			btVector3 angVelA; bodyA.internalGetAngularVelocity(angVelA);
			btVector3 angVelB; bodyB.internalGetAngularVelocity(angVelB);
			btVector3 relVel = angVelB - angVelA;
			if (relVel.length2() > SIMD_EPSILON)
			{
				btVector3 relVelAxis = relVel.normalized();
				btScalar m_kDamping =  btScalar(1.) /
					(getRigidBodyA().computeAngularImpulseDenominator(relVelAxis) +
					 getRigidBodyB().computeAngularImpulseDenominator(relVelAxis));
				btVector3 impulse = m_damping * m_kDamping * relVel;

				btScalar  impulseMag  = impulse.length();
				btVector3 impulseAxis = impulse / impulseMag;
				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*impulseAxis, impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*impulseAxis, -impulseMag);
			}
		}

		// joint limits
		{
			///solve angular part
			btVector3 angVelA;
			bodyA.internalGetAngularVelocity(angVelA);
			btVector3 angVelB;
			bodyB.internalGetAngularVelocity(angVelB);

			// solve swing limit
			if (m_solveSwingLimit)
			{
				btScalar amplitude = m_swingLimitRatio * m_swingCorrection*m_biasFactor/timeStep;
				btScalar relSwingVel = (angVelB - angVelA).dot(m_swingAxis);
				if (relSwingVel > 0)
					amplitude += m_swingLimitRatio * relSwingVel * m_relaxationFactor;
				btScalar impulseMag = amplitude * m_kSwing;

				// Clamp the accumulated impulse
				btScalar temp = m_accSwingLimitImpulse;
				m_accSwingLimitImpulse = btMax(m_accSwingLimitImpulse + impulseMag, btScalar(0.0) );
				impulseMag = m_accSwingLimitImpulse - temp;

				btVector3 impulse = m_swingAxis * impulseMag;

				// don't let cone response affect twist
				// (this can happen since body A's twist doesn't match body B's AND we use an elliptical cone limit)
				{
					btVector3 impulseTwistCouple = impulse.dot(m_twistAxisA) * m_twistAxisA;
					btVector3 impulseNoTwistCouple = impulse - impulseTwistCouple;
					impulse = impulseNoTwistCouple;
				}

				impulseMag = impulse.length();
				btVector3 noTwistSwingAxis = impulse / impulseMag;

				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*noTwistSwingAxis, impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*noTwistSwingAxis, -impulseMag);
			}


			// solve twist limit
			if (m_solveTwistLimit)
			{
				btScalar amplitude = m_twistLimitRatio * m_twistCorrection*m_biasFactor/timeStep;
				btScalar relTwistVel = (angVelB - angVelA).dot( m_twistAxis );
				if (relTwistVel > 0) // only damp when moving towards limit (m_twistAxis flipping is important)
					amplitude += m_twistLimitRatio * relTwistVel * m_relaxationFactor;
				btScalar impulseMag = amplitude * m_kTwist;

				// Clamp the accumulated impulse
				btScalar temp = m_accTwistLimitImpulse;
				m_accTwistLimitImpulse = btMax(m_accTwistLimitImpulse + impulseMag, btScalar(0.0) );
				impulseMag = m_accTwistLimitImpulse - temp;

		//		btVector3 impulse = m_twistAxis * impulseMag;

				bodyA.internalApplyImpulse(btVector3(0,0,0), m_rbA.getInvInertiaTensorWorld()*m_twistAxis,impulseMag);
				bodyB.internalApplyImpulse(btVector3(0,0,0), m_rbB.getInvInertiaTensorWorld()*m_twistAxis,-impulseMag);
			}		
		}
	}
#else
btAssert(0);
#endif //__SPU__
}